

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManPrintTents_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vObjs)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int Entry;
  
  pGVar2 = p->pObjs;
  if (pGVar2 <= pObj) {
    do {
      if (pGVar2 + p->nObjs <= pObj) break;
      Entry = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= Entry) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[Entry] == p->nTravIds) {
        return;
      }
      p->pTravIds[Entry] = p->nTravIds;
      if (pGVar2 + p->nObjs <= pObj) break;
      Vec_IntPush(vObjs,Entry);
      if ((~(uint)*(ulong *)pObj & 0x9fffffff) == 0) {
        return;
      }
      Gia_ManPrintTents_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),vObjs);
      uVar1 = (uint)*(ulong *)pObj;
      if ((int)uVar1 < 0) {
        return;
      }
      if ((uVar1 & 0x1fffffff) == 0x1fffffff) {
        return;
      }
      pObj = pObj + -(ulong)((uint)(*(ulong *)pObj >> 0x20) & 0x1fffffff);
      pGVar2 = p->pObjs;
    } while (pGVar2 <= pObj);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManPrintTents_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vObjs )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    Vec_IntPush( vObjs, Gia_ObjId(p, pObj) );
    if ( Gia_ObjIsCi(pObj) )
        return;
    Gia_ManPrintTents_rec( p, Gia_ObjFanin0(pObj), vObjs );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManPrintTents_rec( p, Gia_ObjFanin1(pObj), vObjs );
}